

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c352.c
# Opt level: O2

void device_reset_c352(void *chip)

{
  byte *pbVar1;
  long lVar2;
  C352 *c;
  uint MuteMask;
  
  pbVar1 = (byte *)((long)chip + 0x2c);
  MuteMask = 0;
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
    MuteMask = MuteMask | (uint)*pbVar1 << ((byte)lVar2 & 0x1f);
    pbVar1 = pbVar1 + 0x24;
  }
  memset((void *)((long)chip + 0xc),0,0x480);
  *(undefined4 *)((long)chip + 0x48c) = 0x1234;
  c352_set_mute_mask(chip,MuteMask);
  return;
}

Assistant:

static void device_reset_c352(void *chip)
{
	C352 *c = (C352 *)chip;
	UINT32 muteMask;
	
	muteMask = c352_get_mute_mask(c);
	
	// clear all channels states
	memset(c->v,0,sizeof(C352_Voice)*C352_VOICES);
	
	// init noise generator
	c->random = 0x1234;
	c->control = 0;
	
	c352_set_mute_mask(c, muteMask);
	
	return;
}